

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::multiplyRep(string *unit_string,size_t loc,size_t sz)

{
  char cVar1;
  size_type sVar2;
  reference pvVar3;
  size_type in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type unaff_retaddr;
  value_type tchar2;
  size_type in_stack_00000008;
  value_type tchar;
  size_type in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  value_type vVar4;
  
  if (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,in_RDX,
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
  }
  else {
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(in_RDI);
    if ((long)&(in_RSI->_M_dataplus)._M_p + in_RDX < sVar2) {
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffe7,
                                     CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
                            in_stack_ffffffffffffffd8);
      vVar4 = *pvVar3;
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(vVar4,CONCAT16(in_stack_ffffffffffffffe6,
                                                    in_stack_ffffffffffffffe0)),
                            in_stack_ffffffffffffffd8);
      cVar1 = *pvVar3;
      if ((((vVar4 == '*') || (vVar4 == '/')) || (vVar4 == '^')) ||
         (((cVar1 == '*' || (cVar1 == '/')) || (cVar1 == '^')))) {
        if ((((vVar4 == '*') || (vVar4 == '/')) || (vVar4 == '^')) &&
           (((cVar1 == '*' || (cVar1 == '/')) || (cVar1 == '^')))) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase(in_RSI,in_RDX,CONCAT17(vVar4,CONCAT16(cVar1,in_stack_ffffffffffffffe0)));
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase(in_RSI,in_RDX,CONCAT17(vVar4,CONCAT16(cVar1,in_stack_ffffffffffffffe0)));
        }
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sz,
                in_stack_00000008,unaff_retaddr,(char *)in_RDI);
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_RSI,in_RDX,
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
      if (((*pvVar3 == '^') ||
          (pvVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffffe7,
                                        CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0
                                                ))), *pvVar3 == '*')) ||
         (pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffffe7,
                                       CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)
                                      )), *pvVar3 == '/')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
      }
    }
  }
  return;
}

Assistant:

static void multiplyRep(std::string& unit_string, size_t loc, size_t sz)
{
    if (loc == 0) {
        unit_string.erase(0, sz);
        return;
    }
    if (unit_string.size() <= loc + sz) {
        unit_string.erase(loc, sz);
        if (unit_string.back() == '^' || unit_string.back() == '*' ||
            unit_string.back() == '/') {
            unit_string.pop_back();
        }
        return;
    }
    auto tchar = unit_string[loc - 1];
    auto tchar2 = unit_string[loc + sz];
    if (tchar == '*' || tchar == '/' || tchar == '^' || tchar2 == '*' ||
        tchar2 == '/' || tchar2 == '^') {
        if ((tchar == '*' || tchar == '/' || tchar == '^') &&
            (tchar2 == '*' || tchar2 == '/' || tchar2 == '^')) {
            unit_string.erase(loc - 1, sz + 1);
        } else {
            unit_string.erase(loc, sz);
        }
    } else {
        unit_string.replace(loc, sz, "*");
    }
}